

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::InputFloat(char *label,float *v,float step,float step_fast,int decimal_precision,
                      ImGuiInputTextFlags flags)

{
  bool bVar1;
  char format [16];
  
  format[0] = '%';
  format[1] = 'f';
  format[2] = '\0';
  format[3] = '\0';
  format[4] = '\0';
  format[5] = '\0';
  format[6] = '\0';
  format[7] = '\0';
  format[8] = '\0';
  format[9] = '\0';
  format[10] = '\0';
  format[0xb] = '\0';
  format[0xc] = '\0';
  format[0xd] = '\0';
  format[0xe] = '\0';
  format[0xf] = '\0';
  if (-1 < decimal_precision) {
    ImFormatString(format,0x10,"%%.%df",decimal_precision);
  }
  bVar1 = InputFloat(label,v,step,step_fast,format,flags);
  return bVar1;
}

Assistant:

bool ImGui::InputFloat(const char* label, float* v, float step, float step_fast, int decimal_precision, ImGuiInputTextFlags flags)
{
    char format[16] = "%f";
    if (decimal_precision >= 0)
        ImFormatString(format, IM_ARRAYSIZE(format), "%%.%df", decimal_precision);
    return InputFloat(label, v, step, step_fast, format, flags);
}